

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O0

int x509_profile_check_key
              (mbedtls_x509_crt_profile *profile,mbedtls_pk_type_t pk_alg,mbedtls_pk_context *pk)

{
  size_t sVar1;
  mbedtls_ecp_keypair *pmVar2;
  mbedtls_ecp_group_id gid;
  mbedtls_pk_context *pk_local;
  mbedtls_pk_type_t pk_alg_local;
  mbedtls_x509_crt_profile *profile_local;
  
  if ((pk_alg == MBEDTLS_PK_RSA) || (pk_alg == MBEDTLS_PK_RSASSA_PSS)) {
    sVar1 = mbedtls_pk_get_bitlen(pk);
    if (sVar1 < profile->rsa_min_bitlen) {
      profile_local._4_4_ = -1;
    }
    else {
      profile_local._4_4_ = 0;
    }
  }
  else if (pk_alg == MBEDTLS_PK_ECDSA) {
    pmVar2 = mbedtls_pk_ec(*pk);
    if ((profile->allowed_curves & 1 << ((char)(pmVar2->grp).id - 1U & 0x1f)) == 0) {
      profile_local._4_4_ = -1;
    }
    else {
      profile_local._4_4_ = 0;
    }
  }
  else {
    profile_local._4_4_ = -1;
  }
  return profile_local._4_4_;
}

Assistant:

static int x509_profile_check_key( const mbedtls_x509_crt_profile *profile,
                                   mbedtls_pk_type_t pk_alg,
                                   const mbedtls_pk_context *pk )
{
#if defined(MBEDTLS_RSA_C)
    if( pk_alg == MBEDTLS_PK_RSA || pk_alg == MBEDTLS_PK_RSASSA_PSS )
    {
        if( mbedtls_pk_get_bitlen( pk ) >= profile->rsa_min_bitlen )
            return( 0 );

        return( -1 );
    }
#endif

#if defined(MBEDTLS_ECDSA_C)
    if( pk_alg == MBEDTLS_PK_ECDSA )
    {
        mbedtls_ecp_group_id gid = mbedtls_pk_ec( *pk )->grp.id;

        if( ( profile->allowed_curves & MBEDTLS_X509_ID_FLAG( gid ) ) != 0 )
            return( 0 );

        return( -1 );
    }
#endif

    return( -1 );
}